

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZEncoder.cpp
# Opt level: O0

EncodeResult * ZXing::Aztec::Encoder::Encode(string *data,int minECCPercent,int userSpecifiedLayers)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  invalid_argument *piVar5;
  reference pvVar6;
  int in_ECX;
  int in_EDX;
  EncodeResult *in_RDI;
  int k_1;
  int j_1;
  int i_3;
  int k;
  int columnOffset;
  int j;
  int rowSize;
  int rowOffset;
  int i_2;
  BitMatrix *matrix;
  int newOffset;
  int i_1;
  int center;
  int origCenter;
  int matrixSize;
  vector<int,_std::allocator<int>_> alignmentMap;
  int baseMatrixSize;
  BitArray modeMessage;
  int messageSizeInWords;
  BitArray messageBits;
  int usableBitsInLayers_1;
  int i;
  int usableBitsInLayers;
  BitArray stuffedBits;
  int wordSize;
  int totalBitsInLayer;
  int layers;
  bool compact;
  int totalSizeBits;
  int eccBits;
  BitArray bits;
  EncodeResult *output;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffda0;
  allocator_type *in_stack_fffffffffffffda8;
  value_type in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  BitMatrix *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdcc;
  BitArray *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined8 in_stack_fffffffffffffde8;
  BitArray *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  BitArray *in_stack_fffffffffffffe20;
  int local_1bc;
  uint local_17c;
  int local_174;
  int local_170;
  int local_168;
  int local_15c;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int iVar8;
  int local_124;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  int local_dc;
  int local_bc;
  int local_b8;
  int local_b4;
  undefined1 local_ad;
  string local_80 [56];
  int local_48;
  int local_44;
  int local_40;
  byte local_39;
  int local_38;
  int local_34;
  int local_18;
  int local_14;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_18 = in_ECX;
  local_14 = in_EDX;
  HighLevelEncoder::Encode((string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  iVar2 = BitArray::size((BitArray *)in_stack_fffffffffffffda0._M_current);
  local_34 = (iVar2 * local_14) / 100 + 0xb;
  local_38 = BitArray::size((BitArray *)in_stack_fffffffffffffda0._M_current);
  local_38 = local_38 + local_34;
  BitArray::BitArray((BitArray *)0x26271c);
  if (local_18 == 0) {
    local_48 = 0;
    local_b8 = 0;
    do {
      if (0x20 < local_b8) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar5,"Data too large for an Aztec code");
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_39 = local_b8 < 4;
      if ((bool)local_39) {
        local_1bc = local_b8 + 1;
      }
      else {
        local_1bc = local_b8;
      }
      local_40 = local_1bc;
      local_44 = TotalBitsInLayer(local_1bc,(bool)local_39);
      if (local_38 <= local_44) {
        if (local_48 != *(int *)(WORD_SIZE + (long)local_40 * 4)) {
          local_48 = *(int *)(WORD_SIZE + (long)local_40 * 4);
          StuffBits(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                    (BitArray *)in_stack_fffffffffffffdc0);
        }
        local_bc = local_44 - local_44 % local_48;
        if ((((local_39 & 1) == 0) ||
            (iVar2 = BitArray::size((BitArray *)in_stack_fffffffffffffda0._M_current),
            iVar2 <= local_48 * 0x40)) &&
           (iVar2 = BitArray::size((BitArray *)in_stack_fffffffffffffda0._M_current),
           iVar2 + local_34 <= local_bc)) goto LAB_00262c4a;
      }
      local_b8 = local_b8 + 1;
    } while( true );
  }
  local_39 = local_18 < 0;
  local_40 = local_18;
  if (local_18 < 1) {
    local_40 = -local_18;
  }
  iVar2 = 0x20;
  if ((bool)local_39) {
    iVar2 = 4;
  }
  if (iVar2 < local_40) {
    local_ad = 1;
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(iVar8);
    std::operator+((char *)in_stack_fffffffffffffda8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffda0._M_current);
    std::invalid_argument::invalid_argument(piVar5,local_80);
    local_ad = 0;
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_44 = TotalBitsInLayer(local_40,(bool)local_39);
  local_48 = *(int *)(WORD_SIZE + (long)local_40 * 4);
  local_b4 = local_44 - local_44 % local_48;
  StuffBits(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
            (BitArray *)in_stack_fffffffffffffdc0);
  iVar2 = BitArray::size((BitArray *)in_stack_fffffffffffffda0._M_current);
  if (local_b4 < iVar2 + local_34) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Data to large for user specified layer");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((local_39 & 1) != 0) &&
     (iVar2 = BitArray::size((BitArray *)in_stack_fffffffffffffda0._M_current),
     local_48 * 0x40 < iVar2)) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Data to large for user specified layer");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_00262c4a:
  BitArray::BitArray((BitArray *)0x262c5f);
  GenerateCheckWords(in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                     (int)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  local_dc = BitArray::size((BitArray *)in_stack_fffffffffffffda0._M_current);
  local_dc = local_dc / local_48;
  BitArray::BitArray((BitArray *)0x262cb7);
  GenerateModeMessage(SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0),
                      (int)in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20)
                      ,(BitArray *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  local_118.field_2._12_4_ = ((byte)~local_39 & 1) * 3 + 0xb + local_40 * 4;
  std::allocator<int>::allocator((allocator<int> *)0x262d39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
             (size_type)in_stack_fffffffffffffdb8,
             (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8);
  std::allocator<int>::~allocator((allocator<int> *)0x262d6d);
  if ((local_39 & 1) == 0) {
    local_124 = local_118.field_2._12_4_ + 1 + (((int)local_118.field_2._12_4_ / 2 + -1) / 0xf) * 2;
    iVar2 = (int)local_118.field_2._12_4_ / 2;
    for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
      iVar3 = iVar8 + iVar8 / 0xf;
      iVar4 = local_124 / 2 - iVar3;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&local_118,
                          (long)((iVar2 - iVar8) + -1));
      *pvVar6 = iVar4 + -1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&local_118,(long)(iVar2 + iVar8));
      *pvVar6 = local_124 / 2 + iVar3 + 1;
    }
  }
  else {
    local_124 = local_118.field_2._12_4_;
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    __last._M_current._4_4_ = in_stack_fffffffffffffd9c;
    __last._M_current._0_4_ = in_stack_fffffffffffffd98;
    std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (in_stack_fffffffffffffda0,__last,0);
  }
  in_RDI->compact = (bool)(local_39 & 1);
  in_RDI->size = local_124;
  in_RDI->layers = local_40;
  in_RDI->codeWords = local_dc;
  BitMatrix::BitMatrix((BitMatrix *)in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd9c);
  for (local_15c = 0; local_15c < local_40; local_15c = local_15c + 1) {
    iVar2 = local_40 - local_15c;
    iVar8 = 0xc;
    if ((local_39 & 1) != 0) {
      iVar8 = 9;
    }
    for (local_168 = 0; local_168 < iVar2 * 4 + iVar8; local_168 = local_168 + 1) {
      for (local_170 = 0; local_170 < 2; local_170 = local_170 + 1) {
        bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffda0._M_current,
                              in_stack_fffffffffffffd9c);
        if (bVar1) {
          pbVar7 = &local_118;
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)pbVar7,(long)(local_170 + local_15c * 2));
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)pbVar7,(long)(local_168 + local_15c * 2));
          BitMatrix::set((BitMatrix *)in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd9c
                         ,in_stack_fffffffffffffd98,false);
        }
        bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffda0._M_current,
                              in_stack_fffffffffffffd9c);
        if (bVar1) {
          pbVar7 = &local_118;
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)pbVar7,(long)(local_168 + local_15c * 2));
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)pbVar7,
                     (long)((~(local_15c * 2) + local_118.field_2._12_4_) - local_170));
          BitMatrix::set((BitMatrix *)in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd9c
                         ,in_stack_fffffffffffffd98,false);
        }
        bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffda0._M_current,
                              in_stack_fffffffffffffd9c);
        if (bVar1) {
          in_stack_fffffffffffffdb8 = &local_118;
          in_stack_fffffffffffffdc0 = &in_RDI->matrix;
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb8,
                     (long)((~(local_15c * 2) + local_118.field_2._12_4_) - local_170));
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb8,
                     (long)((~(local_15c * 2) + local_118.field_2._12_4_) - local_168));
          BitMatrix::set((BitMatrix *)in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd9c
                         ,in_stack_fffffffffffffd98,false);
        }
        bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffda0._M_current,
                              in_stack_fffffffffffffd9c);
        in_stack_fffffffffffffdb4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdb4);
        if (bVar1) {
          in_stack_fffffffffffffda0._M_current = (int *)&local_118;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              in_stack_fffffffffffffda0._M_current,
                              (long)((~(local_15c * 2) + local_118.field_2._12_4_) - local_168));
          in_stack_fffffffffffffdb0 = *pvVar6;
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0._M_current,
                     (long)(local_170 + local_15c * 2));
          BitMatrix::set((BitMatrix *)in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd9c
                         ,in_stack_fffffffffffffd98,false);
        }
      }
    }
  }
  DrawModeMessage(in_stack_fffffffffffffdc0,SUB81((ulong)in_stack_fffffffffffffdb8 >> 0x38,0),
                  (int)in_stack_fffffffffffffdb8,
                  (BitArray *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  if ((local_39 & 1) == 0) {
    DrawBullsEye((BitMatrix *)in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd9c,
                 in_stack_fffffffffffffd98);
    for (local_174 = 0; local_174 < (int)local_118.field_2._12_4_ / 2 + -1;
        local_174 = local_174 + 0xf) {
      iVar2 = local_174;
      for (local_17c = local_124 / 2 & 1; (int)local_17c < local_124; local_17c = local_17c + 2) {
        BitMatrix::set((BitMatrix *)in_stack_fffffffffffffda0._M_current,iVar2,
                       in_stack_fffffffffffffd98,false);
        BitMatrix::set((BitMatrix *)in_stack_fffffffffffffda0._M_current,iVar2,
                       in_stack_fffffffffffffd98,false);
        BitMatrix::set((BitMatrix *)in_stack_fffffffffffffda0._M_current,iVar2,
                       in_stack_fffffffffffffd98,false);
        BitMatrix::set((BitMatrix *)in_stack_fffffffffffffda0._M_current,iVar2,
                       in_stack_fffffffffffffd98,false);
      }
    }
  }
  else {
    DrawBullsEye((BitMatrix *)in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd9c,
                 in_stack_fffffffffffffd98);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  BitArray::~BitArray((BitArray *)0x263653);
  BitArray::~BitArray((BitArray *)0x263660);
  BitArray::~BitArray((BitArray *)0x26366d);
  BitArray::~BitArray((BitArray *)0x26367a);
  return in_RDI;
}

Assistant:

EncodeResult
Encoder::Encode(const std::string& data, int minECCPercent, int userSpecifiedLayers)
{
	// High-level encode
	BitArray bits = HighLevelEncoder::Encode(data);

	// stuff bits and choose symbol size
	int eccBits = bits.size() * minECCPercent / 100 + 11;
	int totalSizeBits = bits.size() + eccBits;
	bool compact;
	int layers;
	int totalBitsInLayer;
	int wordSize;
	BitArray stuffedBits;
	if (userSpecifiedLayers != DEFAULT_AZTEC_LAYERS) {
		compact = userSpecifiedLayers < 0;
		layers = std::abs(userSpecifiedLayers);
		if (layers > (compact ? MAX_NB_BITS_COMPACT : MAX_NB_BITS)) {
			throw std::invalid_argument("Illegal value for layers: " + std::to_string(userSpecifiedLayers));
		}
		totalBitsInLayer = TotalBitsInLayer(layers, compact);
		wordSize = WORD_SIZE[layers];
		int usableBitsInLayers = totalBitsInLayer - (totalBitsInLayer % wordSize);
		StuffBits(bits, wordSize, stuffedBits);
		if (stuffedBits.size() + eccBits > usableBitsInLayers) {
			throw std::invalid_argument("Data to large for user specified layer");
		}
		if (compact && stuffedBits.size() > wordSize * 64) {
			// Compact format only allows 64 data words, though C4 can hold more words than that
			throw std::invalid_argument("Data to large for user specified layer");
		}
	}
	else {
		wordSize = 0;
		// We look at the possible table sizes in the order Compact1, Compact2, Compact3,
		// Compact4, Normal4,...  Normal(i) for i < 4 isn't typically used since Compact(i+1)
		// is the same size, but has more data.
		for (int i = 0; ; i++) {
			if (i > MAX_NB_BITS) {
				throw std::invalid_argument("Data too large for an Aztec code");
			}
			compact = i <= 3;
			layers = compact ? i + 1 : i;
			totalBitsInLayer = TotalBitsInLayer(layers, compact);
			if (totalSizeBits > totalBitsInLayer) {
				continue;
			}
			// [Re]stuff the bits if this is the first opportunity, or if the
			// wordSize has changed
			if (wordSize != WORD_SIZE[layers]) {
				wordSize = WORD_SIZE[layers];
				StuffBits(bits, wordSize, stuffedBits);
			}
			int usableBitsInLayers = totalBitsInLayer - (totalBitsInLayer % wordSize);
			if (compact && stuffedBits.size() > wordSize * 64) {
				// Compact format only allows 64 data words, though C4 can hold more words than that
				continue;
			}
			if (stuffedBits.size() + eccBits <= usableBitsInLayers) {
				break;
			}
		}
	}
	BitArray messageBits;
	GenerateCheckWords(stuffedBits, totalBitsInLayer, wordSize, messageBits);

	// generate mode message
	int messageSizeInWords = stuffedBits.size() / wordSize;
	BitArray modeMessage;
	GenerateModeMessage(compact, layers, messageSizeInWords, modeMessage);

	// allocate symbol
	int baseMatrixSize = (compact ? 11 : 14) + layers * 4; // not including alignment lines
	std::vector<int> alignmentMap(baseMatrixSize, 0);
	int matrixSize;
	if (compact) {
		// no alignment marks in compact mode, alignmentMap is a no-op
		matrixSize = baseMatrixSize;
		std::iota(alignmentMap.begin(), alignmentMap.end(), 0);
	}
	else {
		matrixSize = baseMatrixSize + 1 + 2 * ((baseMatrixSize / 2 - 1) / 15);
		int origCenter = baseMatrixSize / 2;
		int center = matrixSize / 2;
		for (int i = 0; i < origCenter; i++) {
			int newOffset = i + i / 15;
			alignmentMap[origCenter - i - 1] = center - newOffset - 1;
			alignmentMap[origCenter + i] = center + newOffset + 1;
		}
	}

	EncodeResult output{compact, matrixSize, layers, messageSizeInWords, BitMatrix(matrixSize)};

	BitMatrix& matrix = output.matrix;

	// draw data bits
	for (int i = 0, rowOffset = 0; i < layers; i++) {
		int rowSize = (layers - i) * 4 + (compact ? 9 : 12);
		for (int j = 0; j < rowSize; j++) {
			int columnOffset = j * 2;
			for (int k = 0; k < 2; k++) {
				if (messageBits.get(rowOffset + columnOffset + k)) {
					matrix.set(alignmentMap[i * 2 + k], alignmentMap[i * 2 + j]);
				}
				if (messageBits.get(rowOffset + rowSize * 2 + columnOffset + k)) {
					matrix.set(alignmentMap[i * 2 + j], alignmentMap[baseMatrixSize - 1 - i * 2 - k]);
				}
				if (messageBits.get(rowOffset + rowSize * 4 + columnOffset + k)) {
					matrix.set(alignmentMap[baseMatrixSize - 1 - i * 2 - k], alignmentMap[baseMatrixSize - 1 - i * 2 - j]);
				}
				if (messageBits.get(rowOffset + rowSize * 6 + columnOffset + k)) {
					matrix.set(alignmentMap[baseMatrixSize - 1 - i * 2 - j], alignmentMap[i * 2 + k]);
				}
			}
		}
		rowOffset += rowSize * 8;
	}

	// draw mode message
	DrawModeMessage(matrix, compact, matrixSize, modeMessage);

	// draw alignment marks
	if (compact) {
		DrawBullsEye(matrix, matrixSize / 2, 5);
	}
	else {
		DrawBullsEye(matrix, matrixSize / 2, 7);
		for (int i = 0, j = 0; i < baseMatrixSize / 2 - 1; i += 15, j += 16) {
			for (int k = (matrixSize / 2) & 1; k < matrixSize; k += 2) {
				matrix.set(matrixSize / 2 - j, k);
				matrix.set(matrixSize / 2 + j, k);
				matrix.set(k, matrixSize / 2 - j);
				matrix.set(k, matrixSize / 2 + j);
			}
		}
	}
	return output;
}